

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TessellationShaderTessellationMaxInOut::iterate(TessellationShaderTessellationMaxInOut *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  long lVar5;
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  initTest(this);
  (**(code **)(lVar5 + 0x1680))(this->m_po_id_1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glUseProgram() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x939);
  (**(code **)(lVar5 + 0x48))(0x8c8e,0,this->m_tf_bo_id_1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindBufferBase() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x93d);
  (**(code **)(lVar5 + 0x30))(0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBeginTransformFeedback() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x940);
  (**(code **)(lVar5 + 0x538))((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,2);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glDrawArrays() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x944);
  (**(code **)(lVar5 + 0x638))();
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glEndTransformFeedback() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x947);
  bVar1 = compareValues(this,"Per-vertex components test ",this->m_ref_vertex_attributes,
                        this->m_gl_max_tess_evaluation_output_components_value / 4);
  (**(code **)(lVar5 + 0x1680))(this->m_po_id_2);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glUseProgram() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x951);
  (**(code **)(lVar5 + 0x48))(0x8c8e,0,this->m_tf_bo_id_2);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindBufferBase() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x955);
  (**(code **)(lVar5 + 0x30))(0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBeginTransformFeedback() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x958);
  (**(code **)(lVar5 + 0x538))((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,2);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glDrawArrays() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x95c);
  (**(code **)(lVar5 + 0x638))();
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glEndTransformFeedback() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x95f);
  bVar2 = compareValues(this,"Per-patch components test ",this->m_ref_patch_attributes,1);
  if ((bVar1) && (bVar2)) {
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    description = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,testResult,
             description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTessellationMaxInOut::iterate(void)
{
	/* Retrieve ES entry-points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize test-specific ES objects. */
	initTest();

	/* Execute test case 1 */
	gl.useProgram(m_po_id_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed!");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* index */
					  m_tf_bo_id_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed!");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() failed");

	gl.drawArrays(m_glExtTokens.PATCHES, 0, /* first */
				  2);						/* count */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

	/* Verify the rendered data. */
	bool test_passed = true;

	test_passed &= compareValues("Per-vertex components test ", m_ref_vertex_attributes,
								 m_gl_max_tess_evaluation_output_components_value / 4);

	/* Execute test case 2 */
	gl.useProgram(m_po_id_2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed!");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* index */
					  m_tf_bo_id_2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed!");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() failed");

	gl.drawArrays(m_glExtTokens.PATCHES, 0, /* first */
				  2);						/* count */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

	/* Verify the rendered data */
	test_passed &=
		compareValues("Per-patch components test ", m_ref_patch_attributes, 1 /* amount of output vectors */);

	/* Test passed. */
	if (test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}